

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O1

void __thiscall CVmImageWriter::begin_srcf_block(CVmImageWriter *this,int count)

{
  undefined8 in_RAX;
  uint16_t tmp;
  char b [2];
  char b_1 [2];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  begin_block(this,"SRCF",0);
  uStack_18._0_6_ = CONCAT24((short)count,(undefined4)uStack_18);
  CVmFile::write_bytes(this->fp_,(char *)((long)&uStack_18 + 4),2);
  uStack_18 = CONCAT26(8,(undefined6)uStack_18);
  CVmFile::write_bytes(this->fp_,(char *)((long)&uStack_18 + 6),2);
  return;
}

Assistant:

void CVmImageWriter::begin_srcf_block(int count)
{
    /* 
     *   begin the block - SRCF blocks are always optional, since they're
     *   purely for debugging purposes 
     */
    begin_block("SRCF", FALSE);

    /* write the number of entries */
    fp_->write_uint2(count);

    /* each source line record is 8 bytes in the current format */
    fp_->write_uint2(8);
}